

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_ctr.c
# Opt level: O2

void beltCTRStepE(void *buf,size_t count,void *state)

{
  long *plVar1;
  u32 *block;
  int *piVar2;
  ulong count_00;
  long lVar3;
  
  plVar1 = (long *)((long)state + 0x40);
  count_00 = *(ulong *)((long)state + 0x40);
  if (count_00 != 0) {
    if (count <= count_00) {
      memXor2(buf,(void *)((long)plVar1 - count_00),count);
      lVar3 = *plVar1;
      goto LAB_00126445;
    }
    memXor2(buf,(void *)((long)plVar1 - count_00),count_00);
    count = count - *plVar1;
    buf = (void *)((long)buf + *plVar1);
    *plVar1 = 0;
  }
  block = (u32 *)((long)state + 0x30);
  for (; 0xf < count; count = count - 0x10) {
    piVar2 = (int *)((long)state + 0x20);
    *piVar2 = *piVar2 + 1;
    if (*piVar2 == 0) {
      piVar2 = (int *)((long)state + 0x24);
      *piVar2 = *piVar2 + 1;
      if (*piVar2 == 0) {
        piVar2 = (int *)((long)state + 0x28);
        *piVar2 = *piVar2 + 1;
        if (*piVar2 == 0) {
          *(int *)((long)state + 0x2c) = *(int *)((long)state + 0x2c) + 1;
        }
      }
    }
    *(undefined8 *)((long)state + 0x30) = *(undefined8 *)((long)state + 0x20);
    *(undefined8 *)((long)state + 0x38) = *(undefined8 *)((long)state + 0x28);
    beltBlockEncr2(block,(u32 *)state);
    *(ulong *)buf = *buf ^ *(ulong *)((long)state + 0x30);
    *(ulong *)((long)buf + 8) = *(ulong *)((long)buf + 8) ^ *(ulong *)((long)state + 0x38);
    buf = (void *)((long)buf + 0x10);
  }
  if (count == 0) {
    return;
  }
  piVar2 = (int *)((long)state + 0x20);
  *piVar2 = *piVar2 + 1;
  if (*piVar2 == 0) {
    piVar2 = (int *)((long)state + 0x24);
    *piVar2 = *piVar2 + 1;
    if (*piVar2 == 0) {
      piVar2 = (int *)((long)state + 0x28);
      *piVar2 = *piVar2 + 1;
      if (*piVar2 == 0) {
        *(int *)((long)state + 0x2c) = *(int *)((long)state + 0x2c) + 1;
      }
    }
  }
  *(undefined8 *)((long)state + 0x30) = *(undefined8 *)((long)state + 0x20);
  *(undefined8 *)((long)state + 0x38) = *(undefined8 *)((long)state + 0x28);
  beltBlockEncr2(block,(u32 *)state);
  memXor2(buf,block,count);
  lVar3 = 0x10;
LAB_00126445:
  *plVar1 = lVar3 - count;
  return;
}

Assistant:

void beltCTRStepE(void* buf, size_t count, void* state)
{
	belt_ctr_st* st = (belt_ctr_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltCTR_keep()));
	// есть резерв гаммы?
	if (st->reserved)
	{
		if (st->reserved >= count)
		{
			memXor2(buf, st->block + 16 - st->reserved, count);
			st->reserved -= count;
			return;
		}
		memXor2(buf, st->block + 16 - st->reserved, st->reserved);
		count -= st->reserved;
		buf = (octet*)buf + st->reserved;
		st->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 16)
	{
		beltBlockIncU32(st->ctr);
		beltBlockCopy(st->block, st->ctr);
		beltBlockEncr2((u32*)st->block, st->key);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		beltBlockXor2(buf, st->block);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок?
	if (count)
	{
		beltBlockIncU32(st->ctr);
		beltBlockCopy(st->block, st->ctr);
		beltBlockEncr2((u32*)st->block, st->key);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		memXor2(buf, st->block, count);
		st->reserved = 16 - count;
	}
}